

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O1

void __thiscall
TPZFront<float>::STensorProductMTData::Run
          (STensorProductMTData *this,TPZVec<float> *AuxVecCol,TPZVec<float> *AuxVecRow)

{
  long lVar1;
  long lVar2;
  
  this->fAuxVecCol = AuxVecCol;
  this->fAuxVecRow = AuxVecRow;
  this->fWorkDoneCount = 0;
  if (0 < (int)((ulong)((long)(this->fThreads).
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(this->fThreads).
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3)) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      TPZSemaphore::Post((TPZSemaphore *)((long)&((this->fWorkSem).fStore)->fCounter + lVar1));
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x60;
    } while (lVar2 < (int)((ulong)((long)(this->fThreads).
                                         super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->fThreads).
                                        super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  TPZSemaphore::Wait(&this->fWorkDoneSem);
  return;
}

Assistant:

void Run(TPZVec<TVar> &AuxVecCol, TPZVec<TVar> &AuxVecRow){
			this->fAuxVecCol = &AuxVecCol;
			this->fAuxVecRow = &AuxVecRow;
			this->fWorkDoneCount = 0;
			for(int i = 0; i < NThreads(); i++){
				fWorkSem[i].Post();
			}
      fWorkDoneSem.Wait();
		}